

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_and_time.c
# Opt level: O2

LY_ERR lyplg_type_dup_date_and_time(ly_ctx *ctx,lyd_value *original,lyd_value *dup)

{
  LY_ERR LVar1;
  char *pcVar2;
  
  (dup->field_2).dec64 = 0;
  *(undefined8 *)((long)&dup->field_2 + 8) = 0;
  dup->_canonical = (char *)0x0;
  dup->realtype = (lysc_type *)0x0;
  *(undefined8 *)((long)&dup->field_2 + 0x10) = 0;
  LVar1 = lydict_insert(ctx,original->_canonical,0,&dup->_canonical);
  if (LVar1 == LY_SUCCESS) {
    *(undefined8 *)((long)&dup->field_2 + 0x10) = 0;
    (dup->field_2).dec64 = 0;
    *(undefined8 *)((long)&dup->field_2 + 8) = 0;
    (dup->field_2).dec64 = (original->field_2).dec64;
    (dup->field_2).fixed_mem[0x10] = (original->field_2).fixed_mem[0x10];
    pcVar2 = *(char **)((long)&original->field_2 + 8);
    if (pcVar2 != (char *)0x0) {
      pcVar2 = strdup(pcVar2);
      *(char **)((long)&dup->field_2 + 8) = pcVar2;
      if (pcVar2 == (char *)0x0) {
        LVar1 = LY_EMEM;
        goto LAB_001b320b;
      }
    }
    dup->realtype = original->realtype;
    LVar1 = LY_SUCCESS;
  }
  else {
LAB_001b320b:
    lyplg_type_free_date_and_time(ctx,dup);
  }
  return LVar1;
}

Assistant:

static LY_ERR
lyplg_type_dup_date_and_time(const struct ly_ctx *ctx, const struct lyd_value *original, struct lyd_value *dup)
{
    LY_ERR ret;
    struct lyd_value_date_and_time *orig_val, *dup_val;

    memset(dup, 0, sizeof *dup);

    /* optional canonical value */
    ret = lydict_insert(ctx, original->_canonical, 0, &dup->_canonical);
    LY_CHECK_GOTO(ret, error);

    /* allocate value */
    LYPLG_TYPE_VAL_INLINE_PREPARE(dup, dup_val);
    LY_CHECK_ERR_GOTO(!dup_val, ret = LY_EMEM, error);

    LYD_VALUE_GET(original, orig_val);

    /* copy timestamp and unknown tz */
    dup_val->time = orig_val->time;
    dup_val->unknown_tz = orig_val->unknown_tz;

    /* duplicate second fractions */
    if (orig_val->fractions_s) {
        dup_val->fractions_s = strdup(orig_val->fractions_s);
        LY_CHECK_ERR_GOTO(!dup_val->fractions_s, ret = LY_EMEM, error);
    }

    dup->realtype = original->realtype;
    return LY_SUCCESS;

error:
    lyplg_type_free_date_and_time(ctx, dup);
    return ret;
}